

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O3

ThreadManager * __thiscall
GEO::SmartPointer<GEO::ThreadManager>::operator->(SmartPointer<GEO::ThreadManager> *this)

{
  string local_58;
  string local_38;
  
  if (this->pointer_ != (ThreadManager *)0x0) {
    return this->pointer_;
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"pointer_ != nullptr","");
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.h"
             ,"");
  geo_assertion_failed(&local_38,&local_58,0x482);
}

Assistant:

T* operator-> () const {
            geo_assert(pointer_ != nullptr);
            return pointer_;
        }